

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GetConfigsBoundsCase::checkGetConfigsBounds
          (GetConfigsBoundsCase *this,Random *rnd,int numConfigAll,int numConfigRequested)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  pointer puVar3;
  deUint32 dVar4;
  long lVar5;
  char *description;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int numConfigReturned;
  vector<void_*,_std::allocator<void_*>_> buffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> magicBuffer;
  int local_1e4;
  vector<void_*,_std::allocator<void_*>_> local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (&local_1e0,(long)(numConfigAll + 10),(allocator_type *)local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1c8,
             (ulong)((long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2 | 1,(allocator_type *)local_1b0);
  puVar3 = local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = dVar4;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)local_1c8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1c8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar7 = 0;
    do {
      local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] = *(EGLConfig *)(puVar3 + uVar7 * 2);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  eglu::CallLogWrapper::eglGetConfigs
            (&this->super_CallLogWrapper,this->m_display,
             local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,numConfigRequested,&local_1e4);
  dVar4 = eglu::CallLogWrapper::eglGetError(&this->super_CallLogWrapper);
  eglu::checkError(dVar4,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryConfigTests.cpp"
                   ,0x76);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,local_1e4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," configs returned",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if ((long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar5 = (long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar9 = 0;
    do {
      if (local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] == *(EGLConfig *)(puVar3 + lVar9 * 2))
      goto LAB_00e66cea;
      lVar9 = lVar9 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar9);
  }
  lVar9 = 0;
LAB_00e66cea:
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar8 = (int)lVar9;
  std::ostream::operator<<(poVar1,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," values actually written",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (numConfigRequested < 1) {
    numConfigRequested = 0;
  }
  if (numConfigRequested < local_1e4) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, more configs returned than requested.",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Too many configs returned");
  }
  iVar6 = 0;
  if (0 < local_1e4) {
    iVar6 = local_1e4;
  }
  if (iVar6 < iVar8) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, buffer overflow detected.",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    description = "Buffer overflow";
  }
  else {
    if (iVar8 == local_1e4) goto LAB_00e66e93;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Fail, reported number of returned configs differs from number of values written.",
               0x50);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    description = "Incorrect size";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             description);
LAB_00e66e93:
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (EGLConfig *)0x0) {
    operator_delete(local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void checkGetConfigsBounds (de::Random& rnd, const int numConfigAll, const int numConfigRequested)
	{
		tcu::TestLog&			log				= m_testCtx.getLog();
		std::vector<EGLConfig>	buffer			(numConfigAll + 10);

		std::vector<deUint32>	magicBuffer		((buffer.size() * sizeof(EGLConfig)) / sizeof(deUint32) + 1);
		const EGLConfig*		magicConfigs	= reinterpret_cast<EGLConfig*>(&magicBuffer[0]);

		int						numConfigReturned;

		// Fill buffers with magic
		for (size_t ndx = 0; ndx < magicBuffer.size(); ndx++)	magicBuffer[ndx]	= rnd.getUint32();
		for (size_t ndx = 0; ndx < buffer.size(); ndx++)		buffer[ndx]			= magicConfigs[ndx];

		eglGetConfigs(m_display, &buffer[0], numConfigRequested, &numConfigReturned);
		eglu::checkError(eglGetError(), DE_NULL, __FILE__, __LINE__);

		log << TestLog::Message << numConfigReturned << " configs returned" << TestLog::EndMessage;

		// Compare results with stored magic
		{
			int	numOverwritten	= 0;

			for (size_t ndx = 0; ndx < buffer.size(); ndx++)
			{
				if (buffer[ndx] == magicConfigs[ndx])
				{
					numOverwritten = (int)ndx;
					break;
				}
			}

			log << TestLog::Message << numOverwritten << " values actually written" << TestLog::EndMessage;

			if (numConfigReturned > deMax32(numConfigRequested, 0))
			{
				log << TestLog::Message << "Fail, more configs returned than requested." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Too many configs returned");
			}

			if (numOverwritten > deMax32(numConfigReturned, 0))
			{
				log << TestLog::Message << "Fail, buffer overflow detected." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer overflow");
			}
			else if (numOverwritten != numConfigReturned)
			{
				log << TestLog::Message << "Fail, reported number of returned configs differs from number of values written." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect size");
			}
		}
	}